

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O3

void print(int **arr,string *s,int width)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(s->_M_dataplus)._M_p,s->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  uVar5 = (ulong)(uint)bsize;
  if (0 < bsize) {
    lVar7 = 1;
    do {
      if (0 < (int)uVar5) {
        lVar6 = 0;
        do {
          lVar1 = *(long *)(std::cout + -0x18);
          if ((&DAT_002ca289)[lVar1] == '\0') {
            std::ios::widen((char)lVar1 + -0x58);
            (&DAT_002ca289)[lVar1] = 1;
          }
          lVar3 = std::cout;
          _ITM_registerTMCloneTable[lVar1] = (code)0x20;
          *(long *)(std::operator>> + *(long *)(lVar3 + -0x18)) = (long)width;
          std::ostream::operator<<((ostream *)&std::cout,arr[lVar7][lVar6 + 1]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < bsize);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      uVar5 = (ulong)bsize;
      bVar2 = lVar7 < (long)uVar5;
      lVar7 = lVar7 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void print(int **arr, const string &s, int width = 1) {
    cout << s << endl;
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            cout << setfill(' ') << setw(width) << arr[i][j];
        }
        cout << endl;
    }
}